

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdecode.cpp
# Opt level: O0

char * libtorrent::parse_int(char *start,char *end,char delimiter,int64_t *val,error_code_enum *ec)

{
  char cVar1;
  long lVar2;
  long lVar3;
  bool bVar4;
  int digit;
  error_code_enum *ec_local;
  int64_t *val_local;
  char delimiter_local;
  char *end_local;
  char *start_local;
  
  end_local = start;
  while( true ) {
    bVar4 = false;
    if (end_local < end) {
      bVar4 = *end_local != delimiter;
    }
    if (!bVar4) {
      return end_local;
    }
    bVar4 = anon_unknown_10::numeric(*end_local);
    if (!bVar4) {
      *ec = expected_digit;
      return end_local;
    }
    lVar2 = *val;
    lVar3 = std::numeric_limits<long>::max();
    if (lVar3 / 10 < lVar2) break;
    *val = *val * 10;
    cVar1 = *end_local;
    lVar2 = *val;
    lVar3 = std::numeric_limits<long>::max();
    if (lVar3 - (cVar1 + -0x30) < lVar2) {
      *ec = overflow;
      return end_local;
    }
    *val = (long)(cVar1 + -0x30) + *val;
    end_local = end_local + 1;
  }
  *ec = overflow;
  return end_local;
}

Assistant:

char const* parse_int(char const* start, char const* end, char delimiter
		, std::int64_t& val, bdecode_errors::error_code_enum& ec)
	{
		while (start < end && *start != delimiter)
		{
			if (!numeric(*start))
			{
				ec = bdecode_errors::expected_digit;
				return start;
			}
			if (val > std::numeric_limits<std::int64_t>::max() / 10)
			{
				ec = bdecode_errors::overflow;
				return start;
			}
			val *= 10;
			int digit = *start - '0';
			if (val > std::numeric_limits<std::int64_t>::max() - digit)
			{
				ec = bdecode_errors::overflow;
				return start;
			}
			val += digit;
			++start;
		}
		return start;
	}